

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_ParseWithLengthOpts
                  (char *value,size_t buffer_length,char **return_parse_end,
                  cJSON_bool require_null_terminated)

{
  long lVar1;
  int iVar2;
  cJSON_bool cVar3;
  cJSON *item;
  parse_buffer *ppVar4;
  uchar *puVar5;
  long in_FS_OFFSET;
  undefined1 auStack_78 [8];
  parse_buffer buffer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  item = (cJSON *)0x0;
  buffer.hooks.deallocate = (_func_void_void_ptr *)0x0;
  buffer.depth = 0;
  buffer.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  buffer.length = 0;
  buffer.offset = 0;
  auStack_78 = (undefined1  [8])0x0;
  buffer.content = (uchar *)0x0;
  global_error_0 = (char *)0x0;
  global_error_1 = (uchar *)0x0;
  if (buffer_length != 0 && value != (char *)0x0) {
    buffer.length = 0;
    buffer.depth = CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_);
    buffer.hooks.allocate =
         (_func_void_ptr_size_t *)
         CONCAT44(global_hooks.deallocate._4_4_,global_hooks.deallocate._0_4_);
    buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
    auStack_78 = (undefined1  [8])value;
    buffer.content = (uchar *)buffer_length;
    item = (cJSON *)(*(code *)CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_))
                              (0x40);
    if (item == (cJSON *)0x0) {
      item = (cJSON *)0x0;
    }
    else {
      item->valuedouble = 0.0;
      item->string = (char *)0x0;
      item->valuestring = (char *)0x0;
      *(undefined8 *)&item->valueint = 0;
      item->child = (cJSON *)0x0;
      *(undefined8 *)&item->type = 0;
      item->next = (cJSON *)0x0;
      item->prev = (cJSON *)0x0;
      ppVar4 = (parse_buffer *)0x0;
      if ((((auStack_78 != (undefined1  [8])0x0) && (buffer.length == 0)) &&
          (ppVar4 = (parse_buffer *)auStack_78, (uchar *)0x4 < buffer.content)) &&
         (iVar2 = strncmp((char *)auStack_78,anon_var_dwarf_14d,3), iVar2 == 0)) {
        buffer.length = 3;
      }
      ppVar4 = buffer_skip_whitespace(ppVar4);
      cVar3 = parse_value(item,ppVar4);
      if (cVar3 != 0) {
        if (require_null_terminated != 0) {
          if ((auStack_78 != (undefined1  [8])0x0) && (buffer.length < buffer.content)) {
            do {
              puVar5 = (uchar *)buffer.length;
              if (0x20 < *(byte *)((long)auStack_78 + buffer.length)) break;
              buffer.length = buffer.length + 1;
              puVar5 = buffer.content;
            } while (buffer.content != (uchar *)buffer.length);
            if (puVar5 == buffer.content) {
              buffer.length = (size_t)(puVar5 + -1);
            }
          }
          if ((buffer.content <= buffer.length) ||
             (*(uchar *)((long)auStack_78 + buffer.length) != '\0')) goto LAB_00102684;
        }
        if (return_parse_end != (char **)0x0) {
          *return_parse_end = (char *)((long)auStack_78 + buffer.length);
        }
        goto LAB_001026cf;
      }
    }
  }
LAB_00102684:
  if (item != (cJSON *)0x0) {
    cJSON_Delete(item);
  }
  if (value != (char *)0x0) {
    global_error_1 = (uchar *)0x0;
    if (buffer.content != (uchar *)0x0) {
      global_error_1 = buffer.content + -1;
    }
    if (buffer.length < buffer.content) {
      global_error_1 = (uchar *)buffer.length;
    }
    global_error_0 = value;
    if (return_parse_end != (char **)0x0) {
      *return_parse_end = value + (long)global_error_1;
    }
  }
  item = (cJSON *)0x0;
LAB_001026cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithLengthOpts(const char *value, size_t buffer_length, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL || 0 == buffer_length)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = buffer_length;
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(skip_utf8_bom(&buffer))))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }

        global_error = local_error;
    }

    return NULL;
}